

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O0

int __thiscall
FormatTypeRAW::LoadTrack
          (FormatTypeRAW *this,IDisk **created_disk,char *file_path,int side,int track)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  FluxElement *pFVar7;
  bool bVar8;
  uint local_40;
  uchar h1_1;
  uchar h2;
  uchar h1;
  bool overflow;
  uint flux_value;
  uchar h;
  FILE *file;
  int track_local;
  int side_local;
  char *file_path_local;
  IDisk **created_disk_local;
  FormatTypeRAW *this_local;
  
  local_40 = 0;
  this->last_stream_index_position_ = 0;
  this->finished_ = false;
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    bVar2 = false;
    this->stream_position_ = 0;
    this->size_of_flux_value_ = 0x1964;
    auVar1 = ZEXT416(this->size_of_flux_value_) * ZEXT816(8);
    uVar6 = auVar1._0_8_;
    if (auVar1._8_8_ != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    pFVar7 = (FluxElement *)operator_new__(uVar6);
    this->flux_list_ = pFVar7;
    this->nb_flux_value_ = 0;
    std::vector<FormatTypeRAW::IndexElement,_std::allocator<FormatTypeRAW::IndexElement>_>::clear
              (&this->index_list_);
    overflow = (bool)Get(this,(FILE *)__stream);
    while( true ) {
      bVar8 = false;
      if ((this->finished_ & 1U) == 0) {
        iVar5 = feof(__stream);
        bVar8 = iVar5 == 0;
      }
      if (!bVar8) break;
      switch(overflow) {
      case false:
      case true:
      case true:
      case true:
      case true:
      case true:
      case true:
      case true:
        if (!bVar2) {
          local_40 = 0;
        }
        bVar3 = Get(this,(FILE *)__stream);
        local_40 = (uint)overflow * 0x100 + (uint)bVar3 + local_40;
        InsertFluxValue(this,local_40);
        bVar2 = false;
        break;
      case true:
        Get(this,(FILE *)__stream);
      case true:
        Get(this,(FILE *)__stream);
      case true:
        break;
      case true:
        local_40 = local_40 + 0x10000;
        bVar2 = true;
        break;
      case true:
        if (!bVar2) {
          local_40 = 0;
        }
        bVar3 = Get(this,(FILE *)__stream);
        bVar4 = Get(this,(FILE *)__stream);
        local_40 = (uint)bVar3 * 0x100 + (uint)bVar4 + local_40;
        InsertFluxValue(this,local_40);
        bVar2 = false;
        break;
      case true:
        this->stream_position_ = this->stream_position_ - 1;
        HandleOOB(this,(FILE *)__stream);
        break;
      default:
        if (!bVar2) {
          local_40 = 0;
        }
        local_40 = overflow + local_40;
        InsertFluxValue(this,local_40);
        bVar2 = false;
      }
      overflow = (bool)Get(this,(FILE *)__stream);
    }
    fclose(__stream);
    ComputeTrack(this,created_disk,side,track);
    (*(*created_disk)->_vptr_IDisk[0x13])(*created_disk,(ulong)(uint)side,(ulong)(uint)track);
    if (this->flux_list_ != (FluxElement *)0x0) {
      operator_delete__(this->flux_list_);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int FormatTypeRAW::LoadTrack(IDisk*& created_disk, const char* file_path, int side, int track)
{
   FILE* file;

   unsigned char h; // byte header

   unsigned int flux_value = 0;
   last_stream_index_position_ = 0;
   finished_ = false;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      bool overflow = false;
      stream_position_ = 0;
      size_of_flux_value_ = DEFAULT_FLUX_SIZE;

      flux_list_ = new FluxElement[size_of_flux_value_];
      nb_flux_value_ = 0;
      index_list_.clear();

      // Next byte header
      h = Get(file);

      while (!finished_ && !feof(file))
      {
         // decode
         switch (h)
         {
         case 0x0A:
            Get(file); // Skip this byte
         case 0x09:
            Get(file); // Skip this byte
         case 0x08:
            ; // Nothing : Skip header byte
            break;
         case 0x0B:
            // Overflow
            flux_value += 0x10000;
            overflow = true;
            break;
         case 0x0C:
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               unsigned char h2 = Get(file);
               flux_value += (h1 << 8) + h2;
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         case 0x0D:
            --stream_position_;
            HandleOOB(file);
            break;
         case 0:
         case 1:
         case 2:
         case 3:
         case 4:
         case 5:
         case 6:
         case 7: // Flux 2
            {
               if (!overflow) flux_value = 0;

               unsigned char h1 = Get(file);
               flux_value += ((h << 8) + h1);
               InsertFluxValue(flux_value);
               overflow = false;
               break;
            }
         default: // Flux 1
            if (!overflow) flux_value = 0;

            flux_value += h;
            InsertFluxValue(flux_value);
            overflow = false;
            break;
         }

         // Next byte header
         h = Get(file);
      }

      fclose(file);

      // Compute datas
      ComputeTrack(created_disk, side, track);
      created_disk->CreateSingleTrackFromMultiRevolutions(side, track);

      delete[]flux_list_;
   }
   else
   {
      return -1;
   }

   return 0;
}